

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

uint32 __thiscall crnd::dxt3_block::get_alpha(dxt3_block *this,uint32 x,uint32 y,bool scaled)

{
  byte bVar1;
  uint local_20;
  uint32 value;
  bool scaled_local;
  uint32 y_local;
  uint32 x_local;
  dxt3_block *this_local;
  
  bVar1 = this->m_alpha[y * 2 + (x >> 1)];
  if ((x & 1) != 0) {
    bVar1 = bVar1 >> 4;
  }
  local_20 = (uint)bVar1;
  local_20 = local_20 & 0xf;
  if (scaled) {
    local_20 = local_20 << 4 | local_20;
  }
  return local_20;
}

Assistant:

uint32 dxt3_block::get_alpha(uint32 x, uint32 y, bool scaled) const
    {
        CRND_ASSERT((x < cDXTBlockSize) && (y < cDXTBlockSize));

        uint32 value = m_alpha[(y << 1U) + (x >> 1U)];
        if (x & 1)
            value >>= 4;
        value &= 0xF;

        if (scaled)
            value = (value << 4U) | value;

        return value;
    }